

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

lzma_match *
hc_find_func(uint32_t len_limit,uint32_t pos,uint8_t *cur,uint32_t cur_match,uint32_t depth,
            uint32_t *son,uint32_t cyclic_pos,uint32_t cyclic_size,lzma_match *matches,
            uint32_t len_best)

{
  uint uVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint local_8c;
  uint32_t local_7c;
  uint32_t len;
  uint8_t *pb;
  uint32_t delta;
  uint32_t *son_local;
  uint32_t depth_local;
  uint32_t cur_match_local;
  uint8_t *cur_local;
  uint32_t pos_local;
  uint32_t len_limit_local;
  uint64_t x;
  uint local_c;
  
  son[cyclic_pos] = cur_match;
  son_local._0_4_ = depth;
  son_local._4_4_ = cur_match;
  do {
    do {
      uVar1 = pos - son_local._4_4_;
      uVar7 = (uint32_t)son_local - 1;
      if (((uint32_t)son_local == 0) || (cyclic_size <= uVar1)) {
        return matches;
      }
      puVar3 = cur + -(ulong)uVar1;
      if (cyclic_pos < uVar1) {
        local_7c = cyclic_size;
      }
      else {
        local_7c = 0;
      }
      son_local._4_4_ = son[(cyclic_pos - uVar1) + local_7c];
      son_local._0_4_ = uVar7;
    } while ((puVar3[len_best] != cur[len_best]) || (*puVar3 != *cur));
    x._4_4_ = 1;
    if (len_limit == 0) {
      __assert_fail("len <= limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                    ,0x2e,
                    "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)")
      ;
    }
    if (0x7fffffff < len_limit) {
      __assert_fail("limit <= UINT32_MAX / 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                    ,0x2f,
                    "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)")
      ;
    }
    while( true ) {
      local_c = len_limit;
      if (len_limit <= x._4_4_) goto LAB_00b95c09;
      uVar4 = read64ne(puVar3 + x._4_4_);
      uVar5 = read64ne(cur + x._4_4_);
      uVar6 = uVar4 - uVar5;
      if (uVar6 != 0) break;
      x._4_4_ = x._4_4_ + 8;
    }
    uVar2 = 0;
    for (; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
      uVar2 = uVar2 + 1;
    }
    uVar2 = (uVar2 >> 3) + x._4_4_;
    local_8c = len_limit;
    if (uVar2 < len_limit) {
      local_8c = uVar2;
    }
    local_c = local_8c;
LAB_00b95c09:
    if (len_best < local_c) {
      len_best = local_c;
      matches->len = local_c;
      matches->dist = uVar1 - 1;
      matches = matches + 1;
      if (local_c == len_limit) {
        return matches;
      }
    }
  } while( true );
}

Assistant:

static lzma_match *
hc_find_func(
		const uint32_t len_limit,
		const uint32_t pos,
		const uint8_t *const cur,
		uint32_t cur_match,
		uint32_t depth,
		uint32_t *const son,
		const uint32_t cyclic_pos,
		const uint32_t cyclic_size,
		lzma_match *matches,
		uint32_t len_best)
{
	son[cyclic_pos] = cur_match;

	while (true) {
		const uint32_t delta = pos - cur_match;
		if (depth-- == 0 || delta >= cyclic_size)
			return matches;

		const uint8_t *const pb = cur - delta;
		cur_match = son[cyclic_pos - delta
				+ (delta > cyclic_pos ? cyclic_size : 0)];

		if (pb[len_best] == cur[len_best] && pb[0] == cur[0]) {
			uint32_t len = lzma_memcmplen(pb, cur, 1, len_limit);

			if (len_best < len) {
				len_best = len;
				matches->len = len;
				matches->dist = delta - 1;
				++matches;

				if (len == len_limit)
					return matches;
			}
		}
	}
}